

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O2

void initMatchList(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,Vec_Int_t **oDep,Vec_Int_t **iMatch,
                  int *iLastItem,Vec_Int_t **oMatch,int *oLastItem,int *iGroup,int *oGroup,
                  int p_equivalence)

{
  int iVar1;
  void *pvVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  
  if (p_equivalence == 0) {
    uVar7 = (ulong)pNtk->vPis->nSize;
    pvVar2 = malloc(uVar7 * 8 + 8);
    for (lVar5 = 0; lVar5 <= (int)uVar7; lVar5 = lVar5 + 1) {
      pVVar3 = Vec_IntAlloc(0);
      *(Vec_Int_t **)((long)pvVar2 + lVar5 * 8) = pVVar3;
      uVar7 = (ulong)(uint)pNtk->vPis->nSize;
    }
    for (lVar5 = 0; lVar5 < pNtk->vPos->nSize; lVar5 = lVar5 + 1) {
      Vec_IntPush(*(Vec_Int_t **)((long)pvVar2 + (long)oDep[lVar5]->nSize * 8),(int)lVar5);
    }
    iVar6 = 0;
    for (lVar5 = 0; lVar5 <= pNtk->vPis->nSize; lVar5 = lVar5 + 1) {
      pVVar3 = *(Vec_Int_t **)((long)pvVar2 + lVar5 * 8);
      iVar1 = pVVar3->nSize;
      if (iVar1 == 0) {
        Vec_IntFree(pVVar3);
      }
      else {
        oMatch[iVar6] = pVVar3;
        for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
          iVar1 = Vec_IntEntry(oMatch[iVar6],iVar4);
          oGroup[iVar1] = iVar6;
          iVar1 = pVVar3->nSize;
        }
        iVar6 = iVar6 + 1;
      }
    }
    *oLastItem = iVar6;
    free(pvVar2);
    iVar6 = pNtk->vPos->nSize;
  }
  else {
    iVar6 = pNtk->vPos->nSize;
    for (lVar5 = 0; lVar5 < iVar6; lVar5 = lVar5 + 1) {
      Vec_IntPush(oMatch[lVar5],(int)lVar5);
      oGroup[lVar5] = (int)lVar5;
      iVar6 = pNtk->vPos->nSize;
      *oLastItem = iVar6;
    }
  }
  pvVar2 = malloc((long)iVar6 * 8 + 8);
  for (lVar5 = 0; lVar5 <= pNtk->vPos->nSize; lVar5 = lVar5 + 1) {
    pVVar3 = Vec_IntAlloc(0);
    *(Vec_Int_t **)((long)pvVar2 + lVar5 * 8) = pVVar3;
  }
  for (lVar5 = 0; lVar5 < pNtk->vPis->nSize; lVar5 = lVar5 + 1) {
    Vec_IntPush(*(Vec_Int_t **)((long)pvVar2 + (long)iDep[lVar5]->nSize * 8),(int)lVar5);
  }
  iVar6 = 0;
  for (lVar5 = 0; lVar5 <= pNtk->vPos->nSize; lVar5 = lVar5 + 1) {
    pVVar3 = *(Vec_Int_t **)((long)pvVar2 + lVar5 * 8);
    iVar1 = pVVar3->nSize;
    if (iVar1 == 0) {
      Vec_IntFree(pVVar3);
    }
    else {
      iMatch[iVar6] = pVVar3;
      for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
        iVar1 = Vec_IntEntry(pVVar3,iVar4);
        iGroup[iVar1] = iVar6;
        pVVar3 = iMatch[iVar6];
        iVar1 = pVVar3->nSize;
      }
      iVar6 = iVar6 + 1;
    }
  }
  *iLastItem = iVar6;
  free(pvVar2);
  return;
}

Assistant:

void initMatchList(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, Vec_Int_t** oDep, Vec_Int_t** iMatch, int* iLastItem, Vec_Int_t** oMatch, int* oLastItem, int* iGroup, int* oGroup, int p_equivalence)
{
    int i, j, curr;
    Vec_Int_t** temp;

    if(!p_equivalence) {
        temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPiNum(pNtk)+1);

        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)    
            temp[i] = Vec_IntAlloc( 0 );    

        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)        
            Vec_IntPush(temp[Vec_IntSize(oDep[i])], i);

        curr = 0;
        for(i = 0; i < Abc_NtkPiNum(pNtk)+1; i++)
        {
            if(Vec_IntSize(temp[i]) == 0)
                Vec_IntFree( temp[i] );

            else
            {
                oMatch[curr] = temp[i];
                
                for(j = 0; j < Vec_IntSize(temp[i]); j++)
                    oGroup[Vec_IntEntry(oMatch[curr], j)] = curr;
            
                curr++;
            }
        }

        *oLastItem = curr;

        ABC_FREE( temp );
    }
    else {
        // the else part fixes the outputs for P-equivalence checking
        for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        {
            Vec_IntPush(oMatch[i], i);
            oGroup[i] = i;
            (*oLastItem) = Abc_NtkPoNum(pNtk);
        }
    }
        
    /*for(j = 0; j < *oLastItem; j++)
    {
        printf("oMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(oMatch[j]); i++)
            printf("%d ", Vec_IntEntry(oMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPoNum(pNtk); i++)
        printf("%d: %d ", i, oGroup[i]);*/

    //////////////////////////////////////////////////////////////////////////////

    temp = ABC_ALLOC( Vec_Int_t*, Abc_NtkPoNum(pNtk)+1 );

    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)    
        temp[i] = Vec_IntAlloc( 0 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)        
        Vec_IntPush(temp[Vec_IntSize(iDep[i])], i);

    curr = 0;
    for(i = 0; i < Abc_NtkPoNum(pNtk)+1; i++)
    {
        if(Vec_IntSize(temp[i]) == 0)
            Vec_IntFree( temp[i] );
        else
        {
            iMatch[curr] = temp[i];
            for(j = 0; j < Vec_IntSize(iMatch[curr]); j++)
                iGroup[Vec_IntEntry(iMatch[curr], j)] = curr;
            curr++;
        }        
    }

    *iLastItem = curr;

    ABC_FREE( temp );        

    /*printf("\n");
    for(j = 0; j < *iLastItem; j++)
    {
        printf("iMatch %d: ", j);
        for(i = 0; i < Vec_IntSize(iMatch[j]); i++)
            printf("%d ", Vec_IntEntry(iMatch[j], i));
        printf("\n");
    }

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
        printf("%d: %d ", i, iGroup[i]);
    printf("\n");*/
}